

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiPlayerDialog.cpp
# Opt level: O2

void __thiscall MidiPlayerDialog::on_addListButton_clicked(MidiPlayerDialog *this)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  char cVar4;
  undefined4 uVar5;
  uint uVar6;
  int iVar7;
  Master *this_00;
  QSettings *pQVar8;
  QFile listFile;
  QString s;
  QString fileName;
  QTextStream listStream;
  
  this_00 = Master::getInstance();
  pQVar8 = Master::getSettings(this_00);
  if (on_addListButton_clicked()::currentDir == '\0') {
    iVar7 = __cxa_guard_acquire(&on_addListButton_clicked()::currentDir);
    if (iVar7 != 0) {
      QString::QString((QString *)&listFile,"Master/LastAddMidiFileListDir");
      fileName.d.d = (Data *)0x0;
      fileName.d.ptr = (char16_t *)0x0;
      fileName.d.size = 0;
      QSettings::value(&s,(QVariant *)pQVar8);
      QVariant::toString();
      QVariant::~QVariant((QVariant *)&s);
      QVariant::~QVariant((QVariant *)&fileName);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&listFile);
      __cxa_atexit(QString::~QString,&on_addListButton_clicked::currentDir,&__dso_handle);
      __cxa_guard_release(&on_addListButton_clicked()::currentDir);
    }
  }
  QString::QString((QString *)&listFile,"Master/qFileDialogOptions");
  QVariant::QVariant((QVariant *)&fileName,0);
  QSettings::value(&s,(QVariant *)pQVar8);
  uVar5 = QVariant::toInt((bool *)&s);
  QVariant::~QVariant((QVariant *)&s);
  QVariant::~QVariant((QVariant *)&fileName);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&listFile);
  QString::QString(&s,(char *)0x0);
  QString::QString((QString *)&listFile,"Play list files (*.*)");
  QFileDialog::getOpenFileName
            (&fileName,this,&s,&on_addListButton_clicked::currentDir,&listFile,0,uVar5);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&listFile);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&s.d);
  if (fileName.d.size != 0) {
    QDir::QDir((QDir *)&listFile,&fileName);
    QDir::absolutePath();
    qVar3 = on_addListButton_clicked::currentDir.d.size;
    pcVar2 = on_addListButton_clicked::currentDir.d.ptr;
    pDVar1 = on_addListButton_clicked::currentDir.d.d;
    on_addListButton_clicked::currentDir.d.d = s.d.d;
    on_addListButton_clicked::currentDir.d.ptr = s.d.ptr;
    s.d.d = pDVar1;
    s.d.ptr = pcVar2;
    on_addListButton_clicked::currentDir.d.size = s.d.size;
    s.d.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&s.d);
    QDir::~QDir((QDir *)&listFile);
    QString::QString((QString *)&listFile,"Master/LastAddMidiFileListDir");
    QVariant::QVariant((QVariant *)&s,&on_addListButton_clicked::currentDir);
    QSettings::setValue((QString *)pQVar8,(QVariant *)&listFile);
    QVariant::~QVariant((QVariant *)&s);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&listFile);
    QFile::QFile(&listFile,&fileName);
    cVar4 = QFile::open(&listFile,1);
    if (cVar4 != '\0') {
      QTextStream::QTextStream(&listStream,(QIODevice *)&listFile);
      uVar6 = QListWidget::currentRow();
      while( true ) {
        cVar4 = QTextStream::atEnd();
        if (cVar4 != '\0') break;
        QTextStream::readLine((longlong)&s.d);
        if (s.d.size != 0) {
          uVar6 = uVar6 + 1;
          QListWidget::insertItem((int)*(undefined8 *)(this->ui + 0x18),(QString *)(ulong)uVar6);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&s.d);
      }
      QListWidget::setCurrentRow((int)*(undefined8 *)(this->ui + 0x18));
      updateCurrentItem(this);
      QTextStream::~QTextStream(&listStream);
    }
    QFile::~QFile(&listFile);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&fileName.d);
  return;
}

Assistant:

void MidiPlayerDialog::on_addListButton_clicked() {
	QSettings *settings = Master::getInstance()->getSettings();
	static QString currentDir = settings->value("Master/LastAddMidiFileListDir").toString();
	QFileDialog::Options qFileDialogOptions = QFileDialog::Options(settings->value("Master/qFileDialogOptions", 0).toInt());
	QString fileName = QFileDialog::getOpenFileName(this, NULL, currentDir, "Play list files (*.*)",
		NULL, qFileDialogOptions);
	if (fileName.isEmpty()) return;
	currentDir = QDir(fileName).absolutePath();
	settings->setValue("Master/LastAddMidiFileListDir", currentDir);
	QFile listFile(fileName);
	if (!listFile.open(QIODevice::ReadOnly)) return;
	QTextStream listStream(&listFile);
	int row = ui->playList->currentRow();
	while (!listStream.atEnd()) {
		QString s = listStream.readLine();
		if (s.isEmpty()) continue;
		ui->playList->insertItem(++row, s);
	}
	ui->playList->setCurrentRow(row);
	updateCurrentItem();
}